

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_program.h
# Opt level: O2

void __thiscall t_program::set_out_path(t_program *this,string *out_path,bool out_path_is_absolute)

{
  string *psVar1;
  char *pcVar2;
  
  psVar1 = &this->out_path_;
  std::__cxx11::string::_M_assign((string *)psVar1);
  this->out_path_is_absolute_ = out_path_is_absolute;
  pcVar2 = (char *)std::__cxx11::string::at((ulong)psVar1);
  if ((*pcVar2 != '/') && (*pcVar2 != '\\')) {
    std::__cxx11::string::push_back((char)psVar1);
    return;
  }
  return;
}

Assistant:

void set_out_path(std::string out_path, bool out_path_is_absolute) {
    out_path_ = out_path;
    out_path_is_absolute_ = out_path_is_absolute;
    // Ensure that it ends with a trailing '/' (or '\' for windows machines)
    char c = out_path_.at(out_path_.size() - 1);
    if (!(c == '/' || c == '\\')) {
      out_path_.push_back('/');
    }
  }